

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  CppType CVar1;
  Extension *this_local;
  
  if ((this->is_repeated & 1U) == 0) {
    if (((byte)this->field_0xa >> 1 & 1) == 0) {
      CVar1 = anon_unknown_59::cpp_type(this->type);
      if (CVar1 == CPPTYPE_STRING) {
        std::__cxx11::string::clear();
      }
      else if (CVar1 == CPPTYPE_MESSAGE) {
        if (((byte)this->field_0xa >> 2 & 1) == 0) {
          (**(code **)(*(long *)this->field_0 + 0x10))();
        }
        else {
          (**(code **)(*(long *)this->field_0 + 0x90))();
        }
      }
      this->field_0xa = this->field_0xa & 0xfd | 2;
    }
  }
  else {
    CVar1 = anon_unknown_59::cpp_type(this->type);
    switch(CVar1) {
    case CPPTYPE_INT32:
      RepeatedField<int>::Clear((RepeatedField<int> *)this->field_0);
      break;
    case CPPTYPE_INT64:
      RepeatedField<long>::Clear((RepeatedField<long> *)this->field_0);
      break;
    case CPPTYPE_UINT32:
      RepeatedField<unsigned_int>::Clear((RepeatedField<unsigned_int> *)this->field_0);
      break;
    case CPPTYPE_UINT64:
      RepeatedField<unsigned_long>::Clear((RepeatedField<unsigned_long> *)this->field_0);
      break;
    case CPPTYPE_DOUBLE:
      RepeatedField<double>::Clear((RepeatedField<double> *)this->field_0);
      break;
    case CPPTYPE_FLOAT:
      RepeatedField<float>::Clear((RepeatedField<float> *)this->field_0);
      break;
    case CPPTYPE_BOOL:
      RepeatedField<bool>::Clear((RepeatedField<bool> *)this->field_0);
      break;
    case CPPTYPE_ENUM:
      RepeatedField<int>::Clear((RepeatedField<int> *)this->field_0);
      break;
    case CPPTYPE_STRING:
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this->field_0);
      break;
    case CPPTYPE_MESSAGE:
      RepeatedPtrField<google::protobuf::MessageLite>::Clear
                ((RepeatedPtrField<google::protobuf::MessageLite> *)this->field_0);
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)      \
  case WireFormatLite::CPPTYPE_##UPPERCASE:    \
    ptr.repeated_##LOWERCASE##_value->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          ptr.string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            ptr.lazymessage_value->Clear();
          } else {
            ptr.message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}